

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_standard_types.cpp
# Opt level: O1

void __thiscall
StringWriter_WriteMaxTwoByteLengthCharString_Test::TestBody
          (StringWriter_WriteMaxTwoByteLengthCharString_Test *this)

{
  uchar *rhs;
  undefined1 auVar1 [8];
  pointer puVar2;
  pointer puVar3;
  StringWriter_WriteMaxTwoByteLengthCharString_Test *pSVar4;
  void *pvVar5;
  void *pvVar6;
  pointer *__ptr;
  char *pcVar7;
  ptrdiff_t _Num;
  size_t __n;
  ulong uVar8;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> body;
  string str;
  AssertHelper local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  undefined1 local_b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_b0;
  pointer local_a8;
  AssertHelper local_a0;
  internal local_98;
  undefined7 uStack_97;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  long local_88;
  void *local_80;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  StringWriter_WriteMaxTwoByteLengthCharString_Test *local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_58,-1);
  pstore::serialize::string_helper::
  write<pstore::serialize::archive::vector_writer&,std::__cxx11::string>
            (&(this->super_StringWriter).writer_,&local_58);
  local_b8 = (undefined1  [8])(local_58._M_string_length + 2);
  local_c8.data_ =
       (AssertHelperData *)
       ((this->super_StringWriter).bytes_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish +
       -(long)(this->super_StringWriter).bytes_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (&local_98,"str.length () + 2","bytes_.size ()",(unsigned_long *)local_b8,
             (unsigned_long *)&local_c8);
  if (local_98 == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_standard_types.cpp"
               ,0x44,pcVar7);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b8 + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  rhs = (this->super_StringWriter).bytes_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start;
  local_b8._0_4_ = 0xfe;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            (&local_98,"0b11111110","*(first++)",(int *)local_b8,rhs);
  if (local_98 == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_standard_types.cpp"
               ,0x46,pcVar7);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b8 + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_b8._0_4_ = 0xff;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            (&local_98,"0b11111111","*(first++)",(int *)local_b8,rhs + 1);
  if (local_98 == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_standard_types.cpp"
               ,0x47,pcVar7);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b8 + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_98,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(rhs + 2),
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(this->super_StringWriter).bytes_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,(allocator_type *)local_b8);
  pvVar5 = operator_new(0x3fff);
  memset(pvVar5,0x61,0x3fff);
  pvVar6 = operator_new(0x3fff);
  memcpy(pvVar6,pvVar5,0x3fff);
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_create_storage
            (&local_78,0x3fff);
  puVar2 = local_78._M_impl.super__Vector_impl_data._M_start;
  memmove(local_78._M_impl.super__Vector_impl_data._M_start,pvVar6,0x3fff);
  local_78._M_impl.super__Vector_impl_data._M_finish = puVar2 + 0x3fff;
  operator_delete(pvVar6,0x3fff);
  uVar8 = (long)local_78._M_impl.super__Vector_impl_data._M_finish -
          (long)local_78._M_impl.super__Vector_impl_data._M_start;
  local_80 = pvVar5;
  local_38 = this;
  if (uVar8 == 0) {
    pvVar5 = (void *)0x0;
  }
  else {
    if ((long)uVar8 < 0) {
      std::__throw_bad_alloc();
    }
    pvVar5 = operator_new(uVar8);
  }
  puVar3 = local_78._M_impl.super__Vector_impl_data._M_finish;
  puVar2 = local_78._M_impl.super__Vector_impl_data._M_start;
  __n = (long)local_78._M_impl.super__Vector_impl_data._M_finish -
        (long)local_78._M_impl.super__Vector_impl_data._M_start;
  if (__n != 0) {
    memmove(pvVar5,local_78._M_impl.super__Vector_impl_data._M_start,__n);
  }
  local_b8 = (undefined1  [8])0x0;
  pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_a8 = (pointer)0x0;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_create_storage
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8,__n);
  auVar1 = local_b8;
  if (puVar3 != puVar2) {
    memmove((void *)local_b8,pvVar5,__n);
  }
  pSVar4 = local_38;
  pvVar6 = local_80;
  pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)auVar1 + __n);
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,uVar8);
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
  ::operator()(&local_c8,local_b8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x171b15)
  ;
  if (local_b8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_b8,(long)local_a8 - (long)local_b8);
  }
  if (local_78._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78._M_impl.super__Vector_impl_data._M_start);
  }
  if ((char)local_c8.data_ == '\0') {
    testing::Message::Message((Message *)local_b8);
    if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_standard_types.cpp"
               ,0x4b,pcVar7);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_b8 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      (**(code **)(*(long *)local_b8 + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  local_c8.data_ =
       (AssertHelperData *)
       ((pSVar4->super_StringWriter).bytes_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish +
       -(long)(pSVar4->super_StringWriter).bytes_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start);
  local_a0.data_ =
       (AssertHelperData *)
       (pSVar4->super_StringWriter).writer_.
       super_writer_base<pstore::serialize::archive::details::vector_writer_policy>.bytes_consumed_;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_b8,"bytes_.size ()","writer_.bytes_consumed ()",
             (unsigned_long *)&local_c8,(unsigned_long *)&local_a0);
  if (local_b8[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (pbStack_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (pbStack_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_standard_types.cpp"
               ,0x4c,pcVar7);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_c8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_c8.data_ + 8))();
    }
  }
  if (pbStack_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_b0,pbStack_b0);
  }
  local_c8.data_ =
       (AssertHelperData *)
       ((pSVar4->super_StringWriter).bytes_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish +
       -(long)(pSVar4->super_StringWriter).bytes_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start);
  local_a0.data_ =
       (AssertHelperData *)
       (pSVar4->super_StringWriter).writer_.
       super_writer_base<pstore::serialize::archive::details::vector_writer_policy>.bytes_consumed_;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_b8,"bytes_.size ()","writer_.bytes_produced ()",
             (unsigned_long *)&local_c8,(unsigned_long *)&local_a0);
  if (local_b8[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (pbStack_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (pbStack_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_standard_types.cpp"
               ,0x4d,pcVar7);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_c8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_c8.data_ + 8))();
    }
  }
  if (pbStack_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_b0,pbStack_b0);
  }
  operator_delete(pvVar6,0x3fff);
  pvVar5 = (void *)CONCAT71(uStack_97,local_98);
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,local_88 - (long)pvVar5);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST_F (StringWriter, WriteMaxTwoByteLengthCharString) {
    auto const src_length = three_byte_varint - 1;
    auto const src_char = 'a';
    std::string const str (src_length, src_char);

    pstore::serialize::write (writer_, str);

    EXPECT_EQ (str.length () + 2, bytes_.size ());
    auto first = std::begin (bytes_);
    EXPECT_EQ (0b11111110, *(first++));
    EXPECT_EQ (0b11111111, *(first++));
    std::vector<std::uint8_t> const body (first, std::end (bytes_));
    std::vector<std::uint8_t> const expected_body (src_length, src_char);

    EXPECT_THAT (body, ::testing::ContainerEq (expected_body));
    EXPECT_EQ (bytes_.size (), writer_.bytes_consumed ());
    EXPECT_EQ (bytes_.size (), writer_.bytes_produced ());
}